

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapLib.c
# Opt level: O0

int Amap_LibCompareGatesByArea(Amap_Gat_t **pp1,Amap_Gat_t **pp2)

{
  double dVar1;
  double Diff;
  Amap_Gat_t **pp2_local;
  Amap_Gat_t **pp1_local;
  
  dVar1 = (*pp1)->dArea - (*pp2)->dArea;
  if (0.0 <= dVar1) {
    if (dVar1 <= 0.0) {
      pp1_local._4_4_ = 0;
    }
    else {
      pp1_local._4_4_ = 1;
    }
  }
  else {
    pp1_local._4_4_ = -1;
  }
  return pp1_local._4_4_;
}

Assistant:

int Amap_LibCompareGatesByArea( Amap_Gat_t ** pp1, Amap_Gat_t ** pp2 )
{
    double Diff = (*pp1)->dArea - (*pp2)->dArea;
    if ( Diff < 0.0 )
        return -1;
    if ( Diff > 0.0 ) 
        return 1;
    return 0; 
}